

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataStream.cpp
# Opt level: O3

void __thiscall
DIS::DataStream::SetStream(DataStream *this,char *buffer,size_t length,Endian stream)

{
  ulong uVar1;
  
  this->_stream_endian = stream;
  this->_write_pos = length;
  this->_read_pos = 0;
  if ((ulong)((long)(this->_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_finish -
             (long)(this->_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start) < length) {
    std::vector<char,_std::allocator<char>_>::resize(&this->_buffer,length);
  }
  else if (length == 0) {
    return;
  }
  uVar1 = 0;
  do {
    (this->_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start[uVar1] = buffer[uVar1];
    uVar1 = uVar1 + 1;
  } while ((uVar1 & 0xffffffff) < length);
  return;
}

Assistant:

void DataStream::SetStream(const char* buffer, size_t length, Endian stream)
{
   // reassign the endian
   _stream_endian = stream;

   _write_pos = length;
   _read_pos = 0;

   // resize the array
   if( _buffer.size() < length )
   {
      _buffer.resize( length );
   }

   // take ownership of the data
   // copy the data, expensive!
   for(unsigned int i=0; i<length; ++i)
   {
      _buffer[i] = buffer[i];
   }
}